

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bdcDec.c
# Opt level: O2

int Bdc_DecomposeFindInitialVarSet(Bdc_Man_t *p,Bdc_Isf_t *pIsf,Bdc_Isf_t *pIsfL,Bdc_Isf_t *pIsfR)

{
  byte bVar1;
  byte bVar2;
  long lVar3;
  uint uVar4;
  int iVar5;
  long lVar6;
  uint uVar7;
  uint uVar8;
  ulong uVar9;
  undefined8 local_50;
  char pVars [16];
  
  if (pIsfL->uSupp != 0) {
    __assert_fail("pIsfL->uSupp == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/bool/bdc/bdcDec.c"
                  ,0xd5,
                  "int Bdc_DecomposeFindInitialVarSet(Bdc_Man_t *, Bdc_Isf_t *, Bdc_Isf_t *, Bdc_Isf_t *)"
                 );
  }
  if (pIsfR->uSupp == 0) {
    uVar7 = 0;
    uVar4 = p->nVars;
    if (p->nVars < 1) {
      uVar4 = 0;
    }
    uVar8 = 0;
    for (; lVar6 = (long)(int)uVar8, uVar4 != uVar7; uVar7 = uVar7 + 1) {
      if ((pIsf->uSupp >> (uVar7 & 0x1f) & 1) != 0) {
        uVar8 = uVar8 + 1;
        pVars[lVar6] = (char)uVar7;
      }
    }
    local_50 = 0;
    if (0 < (int)uVar8) {
      local_50 = (ulong)uVar8;
    }
    uVar9 = 0;
    do {
      if (uVar9 == local_50) {
        return 0;
      }
      bVar1 = pVars[uVar9];
      Kit_TruthExistNew(p->puTemp1,pIsf->puOff,p->nVars,(int)(char)bVar1);
      lVar3 = lVar6;
      while ((long)uVar9 < lVar3 + -1) {
        bVar2 = pVars[lVar3 + -1];
        Kit_TruthExistNew(p->puTemp2,pIsf->puOff,p->nVars,(int)(char)bVar2);
        iVar5 = Kit_TruthIsDisjoint3(pIsf->puOn,p->puTemp1,p->puTemp2,p->nVars);
        lVar3 = lVar3 + -1;
        if (iVar5 != 0) {
          pIsfL->uUniq = 1 << (bVar1 & 0x1f);
          pIsfR->uUniq = 1 << (bVar2 & 0x1f);
          return 1;
        }
      }
      uVar9 = uVar9 + 1;
    } while( true );
  }
  __assert_fail("pIsfR->uSupp == 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/bool/bdc/bdcDec.c"
                ,0xd6,
                "int Bdc_DecomposeFindInitialVarSet(Bdc_Man_t *, Bdc_Isf_t *, Bdc_Isf_t *, Bdc_Isf_t *)"
               );
}

Assistant:

int Bdc_DecomposeFindInitialVarSet( Bdc_Man_t * p, Bdc_Isf_t * pIsf, Bdc_Isf_t * pIsfL, Bdc_Isf_t * pIsfR )
{
    char pVars[16];
    int v, nVars, Beg, End;

    assert( pIsfL->uSupp == 0 );
    assert( pIsfR->uSupp == 0 );

    // fill in the variables
    nVars = 0;
    for ( v = 0; v < p->nVars; v++ )
        if ( pIsf->uSupp & (1 << v) )
            pVars[nVars++] = v;

    // try variable pairs
    for ( Beg = 0; Beg < nVars; Beg++ )
    {
        Kit_TruthExistNew( p->puTemp1, pIsf->puOff, p->nVars, pVars[Beg] ); 
        for ( End = nVars - 1; End > Beg; End-- )
        {
            Kit_TruthExistNew( p->puTemp2, pIsf->puOff, p->nVars, pVars[End] ); 
            if ( Kit_TruthIsDisjoint3(pIsf->puOn, p->puTemp1, p->puTemp2, p->nVars) )
            {
                pIsfL->uUniq = (1 << pVars[Beg]);
                pIsfR->uUniq = (1 << pVars[End]);
                return 1;
            }
        }
    }
    return 0;
}